

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall QRenderRule::paddingRect(QRenderRule *this,QRect *r)

{
  long lVar1;
  bool bVar2;
  QRenderRule *in_RSI;
  long in_FS_OFFSET;
  QRect QVar3;
  int *b;
  QRect br;
  QRenderRule *in_stack_ffffffffffffffb0;
  QRect *in_stack_ffffffffffffffc0;
  QRect *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = borderRect(in_RSI,in_stack_ffffffffffffffc0);
  bVar2 = hasBorder(in_stack_ffffffffffffffb0);
  if (bVar2) {
    border((QRenderRule *)0x4239d4);
    QVar3 = QRect::adjusted(in_stack_ffffffffffffffe8,QVar3.y2.m_i.m_i,QVar3.x2.m_i.m_i,
                            QVar3.y1.m_i.m_i,QVar3.x1.m_i.m_i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar3;
}

Assistant:

QRect QRenderRule::paddingRect(const QRect& r) const
{
    QRect br = borderRect(r);
    if (!hasBorder())
        return br;
    const int *b = border()->borders;
    return br.adjusted(b[LeftEdge], b[TopEdge], -b[RightEdge], -b[BottomEdge]);
}